

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSparseSDF.h
# Opt level: O3

int __thiscall btSparseSdf<3>::RemoveReferences(btSparseSdf<3> *this,btCollisionShape *pcs)

{
  Cell **ppCVar1;
  Cell *pCVar2;
  int iVar3;
  Cell **ppCVar4;
  int iVar5;
  Cell *pCVar6;
  Cell *pCVar7;
  Cell *pCVar8;
  long lVar9;
  
  iVar3 = (this->cells).m_size;
  if (iVar3 < 1) {
    iVar5 = 0;
  }
  else {
    lVar9 = 0;
    iVar5 = 0;
    do {
      ppCVar1 = (this->cells).m_data;
      pCVar6 = ppCVar1[lVar9];
      if (pCVar6 != (Cell *)0x0) {
        pCVar7 = (Cell *)0x0;
        do {
          pCVar2 = pCVar6->next;
          pCVar8 = pCVar6;
          if (pCVar6->pclient == pcs) {
            ppCVar4 = &pCVar7->next;
            if (pCVar7 == (Cell *)0x0) {
              ppCVar4 = ppCVar1 + lVar9;
            }
            *ppCVar4 = pCVar2;
            operator_delete(pCVar6);
            iVar5 = iVar5 + 1;
            pCVar8 = pCVar7;
          }
          pCVar6 = pCVar2;
          pCVar7 = pCVar8;
        } while (pCVar2 != (Cell *)0x0);
        iVar3 = (this->cells).m_size;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar3);
  }
  return iVar5;
}

Assistant:

btScalar				Evaluate(	const btVector3& x,
		const btCollisionShape* shape,
		btVector3& normal,
		btScalar margin)
	{
		/* Lookup cell			*/ 
		const btVector3	scx=x/voxelsz;
		const IntFrac	ix=Decompose(scx.x());
		const IntFrac	iy=Decompose(scx.y());
		const IntFrac	iz=Decompose(scx.z());
		const unsigned	h=Hash(ix.b,iy.b,iz.b,shape);
		Cell*&			root=cells[static_cast<int>(h%cells.size())];
		Cell*			c=root;
		++nqueries;
		while(c)
		{
			++nprobes;
			if(	(c->hash==h)	&&
				(c->c[0]==ix.b)	&&
				(c->c[1]==iy.b)	&&
				(c->c[2]==iz.b)	&&
				(c->pclient==shape))
			{ break; }
			else
			{ c=c->next; }
		}
		if(!c)
		{
			++nprobes;		
			++ncells;
			int sz = sizeof(Cell);
			if (ncells>m_clampCells)
			{
				static int numResets=0;
				numResets++;
//				printf("numResets=%d\n",numResets);
				Reset();
			}

			c=new Cell();
			c->next=root;root=c;
			c->pclient=shape;
			c->hash=h;
			c->c[0]=ix.b;c->c[1]=iy.b;c->c[2]=iz.b;
			BuildCell(*c);
		}
		c->puid=puid;
		/* Extract infos		*/ 
		const int		o[]={	ix.i,iy.i,iz.i};
		const btScalar	d[]={	c->d[o[0]+0][o[1]+0][o[2]+0],
			c->d[o[0]+1][o[1]+0][o[2]+0],
			c->d[o[0]+1][o[1]+1][o[2]+0],
			c->d[o[0]+0][o[1]+1][o[2]+0],
			c->d[o[0]+0][o[1]+0][o[2]+1],
			c->d[o[0]+1][o[1]+0][o[2]+1],
			c->d[o[0]+1][o[1]+1][o[2]+1],
			c->d[o[0]+0][o[1]+1][o[2]+1]};
		/* Normal	*/ 
#if 1
		const btScalar	gx[]={	d[1]-d[0],d[2]-d[3],
			d[5]-d[4],d[6]-d[7]};
		const btScalar	gy[]={	d[3]-d[0],d[2]-d[1],
			d[7]-d[4],d[6]-d[5]};
		const btScalar	gz[]={	d[4]-d[0],d[5]-d[1],
			d[7]-d[3],d[6]-d[2]};
		normal.setX(Lerp(	Lerp(gx[0],gx[1],iy.f),
			Lerp(gx[2],gx[3],iy.f),iz.f));
		normal.setY(Lerp(	Lerp(gy[0],gy[1],ix.f),
			Lerp(gy[2],gy[3],ix.f),iz.f));
		normal.setZ(Lerp(	Lerp(gz[0],gz[1],ix.f),
			Lerp(gz[2],gz[3],ix.f),iy.f));
		normal		=	normal.normalized();
#else
		normal		=	btVector3(d[1]-d[0],d[3]-d[0],d[4]-d[0]).normalized();
#endif
		/* Distance	*/ 
		const btScalar	d0=Lerp(Lerp(d[0],d[1],ix.f),
			Lerp(d[3],d[2],ix.f),iy.f);
		const btScalar	d1=Lerp(Lerp(d[4],d[5],ix.f),
			Lerp(d[7],d[6],ix.f),iy.f);
		return(Lerp(d0,d1,iz.f)-margin);
	}